

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux-syscalls.c
# Opt level: O3

int uv__epoll_pwait(int epfd,uv__epoll_event *events,int nevents,int timeout,uint64_t sigmask)

{
  long lVar1;
  uint64_t local_8;
  
  local_8 = sigmask;
  lVar1 = syscall(0x119,epfd,events,nevents,timeout,&local_8,8);
  return (int)lVar1;
}

Assistant:

int uv__epoll_pwait(int epfd,
                    struct uv__epoll_event* events,
                    int nevents,
                    int timeout,
                    uint64_t sigmask) {
#if defined(__NR_epoll_pwait)
  int result;
  result = syscall(__NR_epoll_pwait,
                   epfd,
                   events,
                   nevents,
                   timeout,
                   &sigmask,
                   sizeof(sigmask));
#if MSAN_ACTIVE
  if (result > 0)
    __msan_unpoison(events, sizeof(events[0]) * result);
#endif
  return result;
#else
  return errno = ENOSYS, -1;
#endif
}